

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

int nn_req_setopt(nn_sockbase *self,int level,int option,void *optval,size_t optvallen)

{
  nn_sockbase *local_40;
  nn_req *req;
  size_t optvallen_local;
  void *optval_local;
  int option_local;
  int level_local;
  nn_sockbase *self_local;
  
  local_40 = self;
  if (self == (nn_sockbase *)0x0) {
    local_40 = (nn_sockbase *)0x0;
  }
  if (level == 0x30) {
    if (option == 1) {
      if (optvallen == 4) {
        *(undefined4 *)&local_40[0x38].vfptr = *optval;
        self_local._4_4_ = 0;
      }
      else {
        self_local._4_4_ = -0x16;
      }
    }
    else {
      self_local._4_4_ = -0x5c;
    }
  }
  else {
    self_local._4_4_ = -0x5c;
  }
  return self_local._4_4_;
}

Assistant:

int nn_req_setopt (struct nn_sockbase *self, int level, int option,
        const void *optval, size_t optvallen)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    if (level != NN_REQ)
        return -ENOPROTOOPT;

    if (option == NN_REQ_RESEND_IVL) {
        if (nn_slow (optvallen != sizeof (int)))
            return -EINVAL;
        req->resend_ivl = *(int*) optval;
        return 0;
    }

    return -ENOPROTOOPT;
}